

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::SmallInteger::stAsFloat(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SmallIntegerValue SVar2;
  Oop v;
  anon_union_8_4_0eb573b0_for_Oop_0 local_10;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_10._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    local_10.uintValue._4_4_ = extraout_var_00;
    if ((local_10._0_4_ & 1) != 0) {
      SVar2 = Oop::decodeSmallInteger((Oop *)&local_10);
      iVar1 = (*interpreter->_vptr_InterpreterProxy[0x14])((double)SVar2,interpreter);
      return iVar1;
    }
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int SmallInteger::stAsFloat(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = v.decodeSmallInteger();
    return interpreter->returnFloat((double)ia);
}